

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void traverse_hplane_sim<PredictionData<double,long>,double>
               (WorkerForSimilarity *workspace,PredictionData<double,_long> *prediction_data,
               ExtIsoForest *model_outputs,vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,
               size_t curr_tree,bool as_kernel)

{
  int iVar1;
  ulong uVar2;
  pointer puVar3;
  pointer pdVar4;
  size_t sVar5;
  long lVar6;
  size_t *psVar7;
  double *pdVar8;
  long lVar9;
  pointer puVar10;
  bool as_kernel_00;
  pointer pIVar11;
  size_t sVar12;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  size_t col;
  ulong uVar17;
  ulong uVar18;
  undefined7 in_register_00000089;
  size_t j;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  size_t col_1;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double unused;
  double local_58;
  long local_50;
  undefined4 local_44;
  double *local_40;
  long local_38;
  
  if (!interrupt_switch) {
    uVar18 = workspace->st;
    uVar17 = workspace->end;
    if (uVar18 != uVar17) {
      if ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar3 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::
        __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (puVar3 + uVar18,puVar3 + uVar17 + 1);
        puVar3 = (workspace->ix_arr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar18 = workspace->st;
        if (workspace->n_from <= puVar3[uVar18]) {
          return;
        }
        uVar17 = workspace->end;
        if (puVar3[uVar17] < workspace->n_from) {
          return;
        }
      }
      pIVar11 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = curr_tree * 0xf8;
      local_44 = (undefined4)CONCAT71(in_register_00000089,as_kernel);
      if (pIVar11[curr_tree].hplane_left == 0) {
        pdVar20 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar8 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (as_kernel) {
          if (pdVar20 == pdVar8) {
            if ((workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              puVar10 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar3 = puVar10 + uVar18;
              _Var13 = std::
                       __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar3,puVar10 + uVar17 + 1,&workspace->n_from);
              puVar10 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar18 = workspace->st;
              uVar14 = ((long)_Var13._M_current - (long)puVar3 >> 3) + uVar18;
              pdVar4 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl
                       .super__Vector_impl_data._M_start;
              sVar12 = workspace->n_from;
              uVar17 = workspace->end;
              for (; uVar18 < uVar14; uVar18 = uVar18 + 1) {
                lVar16 = puVar10[uVar18] * sVar12;
                for (uVar19 = uVar14; uVar19 <= uVar17; uVar19 = uVar19 + 1) {
                  lVar15 = puVar10[uVar19] - sVar12;
                  pdVar4[lVar16 + lVar15] = pdVar4[lVar16 + lVar15] + 1.0;
                }
              }
            }
          }
          else {
            puVar3 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar16 = (long)pdVar8 - (long)pdVar20 >> 3;
            while (uVar18 < uVar17) {
              uVar14 = puVar3[uVar18];
              sVar12 = prediction_data->nrows;
              lVar15 = sVar12 - uVar14;
              uVar18 = uVar18 + 1;
              for (uVar19 = uVar18; uVar19 <= uVar17; uVar19 = uVar19 + 1) {
                uVar2 = puVar3[uVar19];
                if (uVar14 < uVar2) {
                  lVar21 = uVar2 + (lVar16 - uVar14) + ~((ulong)((lVar15 + -1) * lVar15) >> 1);
                }
                else {
                  lVar21 = sVar12 - uVar2;
                  lVar21 = ((uVar14 + lVar16) - uVar2) + ~((ulong)((lVar21 + -1) * lVar21) >> 1);
                }
                pdVar20[lVar21] = pdVar20[lVar21] + 1.0;
              }
            }
          }
        }
        else {
          if (pdVar20 != pdVar8) {
            psVar7 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar12 = prediction_data->nrows;
            if (workspace->assume_full_distr == false) {
              lVar16 = (uVar17 - uVar18) + 1;
              auVar23._8_4_ = (int)((ulong)lVar16 >> 0x20);
              auVar23._0_8_ = lVar16;
              auVar23._12_4_ = 0x45300000;
              dVar22 = expected_separation_depth<double>
                                 ((auVar23._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0) +
                                  pIVar11[curr_tree].remainder);
            }
            else {
              dVar22 = 3.0;
            }
            increase_comb_counter(psVar7,uVar18,uVar17,sVar12,pdVar20,dVar22);
            return;
          }
          pdVar20 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pdVar20 !=
              (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            psVar7 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            sVar12 = workspace->n_from;
            sVar5 = prediction_data->nrows;
            if (workspace->assume_full_distr == false) {
              lVar16 = (uVar17 - uVar18) + 1;
              auVar24._8_4_ = (int)((ulong)lVar16 >> 0x20);
              auVar24._0_8_ = lVar16;
              auVar24._12_4_ = 0x45300000;
              dVar22 = expected_separation_depth<double>
                                 ((auVar24._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0) +
                                  pIVar11[curr_tree].remainder);
            }
            else {
              dVar22 = 3.0;
            }
            increase_comb_counter_in_groups(psVar7,uVar18,uVar17,sVar12,sVar5,pdVar20,dVar22);
            return;
          }
        }
      }
      else {
        if (curr_tree != 0 && !as_kernel) {
          pdVar20 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (pdVar20 ==
              (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            pdVar20 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (pdVar20 !=
                (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              increase_comb_counter_in_groups
                        ((workspace->ix_arr).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start,uVar18,uVar17,workspace->n_from,
                         prediction_data->nrows,pdVar20,-1.0);
            }
          }
          else {
            increase_comb_counter
                      ((workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,uVar18,uVar17,prediction_data->nrows,pdVar20
                       ,-1.0);
          }
        }
        if ((prediction_data->Xc_indptr != (long *)0x0) &&
           ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start)) {
          puVar3 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::
          __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar3 + workspace->st,puVar3 + workspace->end + 1);
        }
        pdVar4 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar12 = workspace->st;
        sVar5 = workspace->end;
        for (lVar15 = 0; sVar5 * 8 + sVar12 * -8 + 8 != lVar15; lVar15 = lVar15 + 8) {
          *(undefined8 *)((long)pdVar4 + lVar15) = 0;
        }
        if (prediction_data->Xc_indptr == (long *)0x0 && prediction_data->categ_data == (int *)0x0)
        {
          lVar15 = 0;
          uVar18 = 0;
          while( true ) {
            pIVar11 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar21 = *(long *)&pIVar11[curr_tree].col_num.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl;
            if ((ulong)((long)*(pointer *)
                               ((long)&pIVar11[curr_tree].col_num.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl + 8) - lVar21 >> 3) <= uVar18) break;
            pdVar20 = &local_58;
            if (model_outputs->missing_action != Fail) {
              pdVar20 = (double *)
                        (*(long *)&pIVar11[curr_tree].fill_val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + lVar15);
            }
            add_linear_comb<double>
                      ((workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,workspace->st,workspace->end,
                       (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       prediction_data->numeric_data +
                       *(long *)(lVar21 + lVar15) * prediction_data->nrows,
                       (double *)
                       (*(long *)&pIVar11[curr_tree].coef.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data + lVar15),0.0,
                       *(double *)
                        (*(long *)&pIVar11[curr_tree].mean.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + lVar15),pdVar20,
                       model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
            uVar18 = uVar18 + 1;
            lVar15 = lVar15 + 8;
          }
        }
        else {
          lVar21 = 0;
          lVar15 = 0;
          local_50 = 0;
          uVar18 = 0;
          local_38 = lVar16;
          while( true ) {
            pIVar11 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar6 = *(long *)((long)&(pIVar11->col_num).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl + lVar16);
            if ((ulong)(*(long *)((long)&(pIVar11->col_num).
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl + lVar16 + 8) - lVar6 >> 3) <= uVar18) break;
            iVar1 = *(int *)(*(long *)((long)&(pIVar11->col_type).
                                              super__Vector_base<ColType,_std::allocator<ColType>_>.
                                              _M_impl + lVar16) + uVar18 * 4);
            if (iVar1 == 0x20) {
              if (model_outputs->cat_split_type == SubSet) {
                pdVar20 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar20 = (double *)
                            (*(long *)((long)&(pIVar11->fill_val).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16) + lVar21);
                }
                local_40 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                lVar9 = *(long *)((long)&(pIVar11->cat_coef).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl + lVar16);
                pdVar8 = *(double **)(lVar9 + local_50 * 0x18);
                add_linear_comb<double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,local_40,
                           prediction_data->categ_data +
                           *(long *)(lVar6 + lVar21) * prediction_data->nrows,
                           (int)((ulong)(*(long *)(lVar9 + 8 + local_50 * 0x18) - (long)pdVar8) >> 3
                                ),pdVar8,0.0,0,pdVar20,
                           (double *)
                           (local_50 * 8 +
                           *(long *)((long)&(pIVar11->fill_new).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl + lVar16)),(size_t *)0x0,(size_t *)0x0,
                           model_outputs->new_cat_action,model_outputs->missing_action,SubSet,false)
                ;
              }
              else if (model_outputs->cat_split_type == SingleCateg) {
                pdVar20 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar20 = (double *)
                            (*(long *)((long)&(pIVar11->fill_val).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16) + lVar21);
                }
                pdVar8 = (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                add_linear_comb<double>
                          ((workspace->ix_arr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,workspace->st,workspace->end,pdVar8,
                           prediction_data->categ_data +
                           *(long *)(lVar6 + lVar21) * prediction_data->nrows,0,(double *)0x0,
                           *(double *)
                            (*(long *)((long)&(pIVar11->fill_new).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16) + local_50 * 8),
                           *(int *)(*(long *)((long)&(pIVar11->chosen_cat).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl + lVar16) + local_50 * 4),pdVar20,
                           pdVar8,(size_t *)0x0,(size_t *)0x0,model_outputs->new_cat_action,
                           model_outputs->missing_action,SingleCateg,false);
              }
              local_50 = local_50 + 1;
            }
            else if (iVar1 == 0x1f) {
              psVar7 = (workspace->ix_arr).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (prediction_data->Xc_indptr == (long *)0x0) {
                pdVar20 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar20 = (double *)
                            (*(long *)((long)&(pIVar11->fill_val).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16) + lVar21);
                }
                add_linear_comb<double>
                          (psVar7,workspace->st,workspace->end,
                           (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           prediction_data->numeric_data +
                           *(long *)(lVar6 + lVar21) * prediction_data->nrows,
                           (double *)
                           (lVar15 * 8 +
                           *(long *)((long)&(pIVar11->coef).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl + lVar16)),0.0,
                           *(double *)
                            (*(long *)((long)&(pIVar11->mean).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16) + lVar15 * 8),pdVar20,
                           model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
              }
              else {
                pdVar20 = &local_58;
                if (model_outputs->missing_action != Fail) {
                  pdVar20 = (double *)
                            (*(long *)((long)&(pIVar11->fill_val).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16) + lVar21);
                }
                add_linear_comb<double,long>
                          (psVar7,workspace->st,workspace->end,*(size_t *)(lVar6 + lVar21),
                           (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>
                           ._M_impl.super__Vector_impl_data._M_start,prediction_data->Xc,
                           prediction_data->Xc_ind,prediction_data->Xc_indptr,
                           (double *)
                           (lVar15 * 8 +
                           *(long *)((long)&(pIVar11->coef).
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl + lVar16)),0.0,
                           *(double *)
                            (*(long *)((long)&(pIVar11->mean).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl + lVar16) + lVar15 * 8),pdVar20,
                           model_outputs->missing_action,(double *)0x0,(size_t *)0x0,false);
                lVar16 = local_38;
              }
              lVar15 = lVar15 + 1;
            }
            uVar18 = uVar18 + 1;
            lVar21 = lVar21 + 8;
          }
        }
        sVar12 = divide_subset_split((workspace->ix_arr).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (workspace->comb_val).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start,workspace->st,workspace->end,
                                     *(double *)((long)&pIVar11->split_point + lVar16));
        uVar18 = workspace->end;
        as_kernel_00 = local_44._0_1_;
        if (workspace->st < sVar12) {
          workspace->end = sVar12 - 1;
          traverse_hplane_sim<PredictionData<double,long>,double>
                    (workspace,prediction_data,model_outputs,hplanes,
                     *(size_t *)
                      ((long)&((hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl.super__Vector_impl_data._M_start)->hplane_left + lVar16),
                     local_44._0_1_);
        }
        if (sVar12 <= uVar18) {
          workspace->st = sVar12;
          workspace->end = uVar18;
          traverse_hplane_sim<PredictionData<double,long>,double>
                    (workspace,prediction_data,model_outputs,hplanes,
                     *(size_t *)
                      ((long)&((hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl.super__Vector_impl_data._M_start)->hplane_right + lVar16),
                     as_kernel_00);
        }
      }
    }
  }
  return;
}

Assistant:

void traverse_hplane_sim(WorkerForSimilarity     &workspace,
                         PredictionData          &prediction_data,
                         ExtIsoForest            &model_outputs,
                         std::vector<IsoHPlane>  &hplanes,
                         size_t                  curr_tree,
                         const bool              as_kernel)
{
    if (interrupt_switch)
        return;
    
    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (hplanes[curr_tree].hplane_left == 0)
    {
        if (!as_kernel)
        {
            if (!workspace.tmat_sep.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.assume_full_distr? 3. : 
                                      expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                  + (ldouble_safe)(workspace.end - workspace.st + 1))
                                      );
            else if (!workspace.rmat.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                                prediction_data.nrows, workspace.rmat.data(),
                                                workspace.assume_full_distr? 3. : 
                                                expected_separation_depth((ldouble_safe) hplanes[curr_tree].remainder
                                                                            + (ldouble_safe)(workspace.end - workspace.st + 1))
                                                );
        }

        else
        {
            if (!workspace.tmat_sep.empty())
            {
                size_t i_, j_;
                for (size_t i = workspace.st; i < workspace.end; i++)
                {
                    i_ = workspace.ix_arr[i];
                    for (size_t j = i + 1; j <= workspace.end; j++)
                    {
                        j_ = workspace.ix_arr[j];
                        workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                    }
                }
            }

            else if (!workspace.rmat.empty())
            {
                size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                               std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                workspace.ix_arr.begin() + workspace.end + 1,
                                                                workspace.n_from));
                double *restrict rmat_this;
                for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                {
                    rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                    for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                    {
                        rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
            increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                  prediction_data.nrows, workspace.tmat_sep.data(), -1.);
        else if (!workspace.rmat.empty())
            increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.n_from,
                                            prediction_data.nrows, workspace.rmat.data(), -1.);
    }

    if (prediction_data.Xc_indptr != NULL && workspace.tmat_sep.size())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);

    /* reconstruct linear combination */
    size_t ncols_numeric = 0;
    size_t ncols_categ   = 0;
    std::fill(workspace.comb_val.begin(), workspace.comb_val.begin() + (workspace.end - workspace.st + 1), 0);
    double unused;
    if (prediction_data.categ_data != NULL || prediction_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
        {
            switch(hplanes[curr_tree].col_type[col])
            {
                case Numeric:
                {
                    if (prediction_data.Xc_indptr == NULL)
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                        prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    else
                        add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end,
                                        hplanes[curr_tree].col_num[col], workspace.comb_val.data(),
                                        prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                        hplanes[curr_tree].coef[ncols_numeric], (double)0, hplanes[curr_tree].mean[ncols_numeric],
                                        (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                        model_outputs.missing_action, NULL, NULL, false);
                    ncols_numeric++;
                    break;
                }

                case Categorical:
                {
                    switch(model_outputs.cat_split_type)
                    {
                        case SingleCateg:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int)0, NULL, hplanes[curr_tree].fill_new[ncols_categ],
                                            hplanes[curr_tree].chosen_cat[ncols_categ],
                                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                                            workspace.comb_val[0], NULL, NULL, model_outputs.new_cat_action,
                                            model_outputs.missing_action, SingleCateg, false);
                            break;
                        }

                        case SubSet:
                        {
                            add_linear_comb<ldouble_safe>(
                                            workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                                            prediction_data.categ_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                                            (int) hplanes[curr_tree].cat_coef[ncols_categ].size(),
                                            hplanes[curr_tree].cat_coef[ncols_categ].data(), (double) 0, (int) 0,
                                            (model_outputs.missing_action == Fail)? unused : hplanes[curr_tree].fill_val[col],
                                            hplanes[curr_tree].fill_new[ncols_categ], NULL, NULL,
                                            model_outputs.new_cat_action, model_outputs.missing_action, SubSet, false);
                            break;
                        }
                    }
                    ncols_categ++;
                    break;
                }

                default:
                {
                    assert(0);
                    break;
                }
            } 
        }
    }

    
    else /* faster version for numerical-only */
    {
        for (size_t col = 0; col < hplanes[curr_tree].col_num.size(); col++)
            add_linear_comb(workspace.ix_arr.data(), workspace.st, workspace.end, workspace.comb_val.data(),
                            prediction_data.numeric_data + prediction_data.nrows * hplanes[curr_tree].col_num[col],
                            hplanes[curr_tree].coef[col], (double)0, hplanes[curr_tree].mean[col],
                            (model_outputs.missing_action == Fail)?  unused : hplanes[curr_tree].fill_val[col],
                            model_outputs.missing_action, NULL, NULL, false);
    }

    /* divide data */
    size_t split_ix = divide_subset_split(workspace.ix_arr.data(), workspace.comb_val.data(),
                                          workspace.st, workspace.end, hplanes[curr_tree].split_point);

    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (split_ix > workspace.st)
    {
        workspace.end = split_ix - 1;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_left,
                            as_kernel);
    }

    if (split_ix <= orig_end)
    {
        workspace.st  = split_ix;
        workspace.end = orig_end;
        traverse_hplane_sim<PredictionData, ldouble_safe>(
                            workspace,
                            prediction_data,
                            model_outputs,
                            hplanes,
                            hplanes[curr_tree].hplane_right,
                            as_kernel);
    }

}